

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseElemModuleField(WastParser *this,Module *module)

{
  ElemSegment *this_00;
  string_view name;
  string_view name_00;
  bool bVar1;
  bool bVar2;
  Result RVar3;
  TokenType TVar4;
  tuple<wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_> tVar5;
  Enum EVar6;
  Var *this_01;
  string initial_name;
  Location loc;
  string segment_name;
  __uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  local_170;
  string local_168;
  Location local_148;
  char *local_128;
  char *local_120;
  char local_118 [16];
  Var local_108;
  Var local_c0;
  Var local_78;
  
  RVar3 = Expect(this,Lpar);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)&local_108,this);
  local_148.field_1.field_1.offset = local_108.loc.field_1.field_1.offset;
  local_148.field_1._8_8_ = local_108.loc.field_1._8_8_;
  local_148.filename.data_ = local_108.loc.filename.data_;
  local_148.filename.size_ = local_108.loc.filename.size_;
  RVar3 = Expect(this,Elem);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  local_168._M_string_length = 0;
  local_168.field_2._M_local_buf[0] = '\0';
  bVar1 = ParseBindVarOpt(this,&local_168);
  local_128 = local_118;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,local_168._M_dataplus._M_p,
             local_168._M_dataplus._M_p + local_168._M_string_length);
  if ((this->options_->features).bulk_memory_enabled_ == false) {
    std::__cxx11::string::_M_replace((ulong)&local_128,0,local_120,0x194a15);
  }
  tVar5.
  super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
  .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
        )operator_new(0xe8);
  name_00.size_ = (size_type)local_120;
  name_00.data_ = local_128;
  *(long *)((long)tVar5.
                  super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl + 8) =
       0;
  *(long *)((long)tVar5.
                  super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl + 0x10)
       = 0;
  *(char **)((long)tVar5.
                   super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                   .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl + 0x18
            ) = local_148.filename.data_;
  *(size_type *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl + 0x20) =
       local_148.filename.size_;
  ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
  ((long)tVar5.
         super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
         .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl + 0x28))->offset
       = (size_t)local_148.field_1.field_1.offset;
  *(undefined8 *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl + 0x30) =
       local_148.field_1._8_8_;
  *(undefined4 *)
   ((long)tVar5.
          super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl + 0x38) = 6;
  *(undefined ***)
   tVar5.
   super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
   .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl =
       &PTR__ElemSegmentModuleField_001b9170;
  this_00 = (ElemSegment *)
            ((long)tVar5.
                   super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                   .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl + 0x40
            );
  ElemSegment::ElemSegment(this_00,name_00);
  if (((this->options_->features).reference_types_enabled_ == true) &&
     (bVar2 = Match(this,Declare), bVar2)) {
    this_00->kind = Declared;
  }
  if ((this->options_->features).bulk_memory_enabled_ == true) {
    bVar1 = PeekMatchLpar(this,Table);
    if (!bVar1) {
      Var::Var(&local_78,0,&local_148);
      ParseVarOpt(this,(Var *)((long)tVar5.
                                     super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                                     .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>.
                                     _M_head_impl + 0x68),&local_78);
      Var::~Var(&local_78);
      goto LAB_0016534b;
    }
    RVar3 = Expect(this,Lpar);
    if ((((RVar3.enum_ != Error) && (RVar3 = Expect(this,Table), RVar3.enum_ != Error)) &&
        (RVar3 = ParseVar(this,(Var *)((long)tVar5.
                                             super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                                             .
                                             super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>
                                             ._M_head_impl + 0x68)), RVar3.enum_ != Error)) &&
       (RVar3 = Expect(this,Rpar), RVar3.enum_ != Error)) goto LAB_0016534b;
  }
  else {
    if (bVar1) {
      name.size_ = local_168._M_string_length;
      name.data_ = local_168._M_dataplus._M_p;
      this_01 = &local_108;
      Var::Var(this_01,name,&local_148);
      Var::operator=((Var *)((long)tVar5.
                                   super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                                   .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>.
                                   _M_head_impl + 0x68),this_01);
    }
    else {
      this_01 = &local_c0;
      Var::Var(this_01,0,&local_148);
      ParseVarOpt(this,(Var *)((long)tVar5.
                                     super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                                     .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>.
                                     _M_head_impl + 0x68),this_01);
    }
    Var::~Var(this_01);
LAB_0016534b:
    if ((this_00->kind != Declared) &&
       (bVar1 = ParseOffsetExprOpt(this,(ExprList *)
                                        ((long)tVar5.
                                               super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                                               .
                                               super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>
                                               ._M_head_impl + 0xb8)), !bVar1)) {
      this_00->kind = Passive;
    }
    bVar1 = ParseRefTypeOpt(this,(Type *)((long)tVar5.
                                                super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                                                .
                                                super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>
                                                ._M_head_impl + 0xb0));
    if (bVar1) {
      ParseElemExprListOpt
                (this,(ElemExprVector *)
                      ((long)tVar5.
                             super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                             .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>.
                             _M_head_impl + 0xd0));
    }
    else {
      ((Type *)((long)tVar5.
                      super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                      .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl +
               0xb0))->enum_ = Funcref;
      TVar4 = Peek(this,0);
      if ((TVar4 == Func) && (RVar3 = Expect(this,Func), RVar3.enum_ == Error)) goto LAB_001653e4;
      ParseElemExprVarListOpt
                (this,(ElemExprVector *)
                      ((long)tVar5.
                             super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                             .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>.
                             _M_head_impl + 0xd0));
    }
    RVar3 = Expect(this,Rpar);
    if (RVar3.enum_ != Error) {
      local_170._M_t.
      super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
      .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl =
           (tuple<wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
            )(tuple<wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
              )tVar5.
               super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
               .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl;
      Module::AppendField(module,(unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                                  *)&local_170);
      if ((_Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
           )local_170._M_t.
            super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
            .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl !=
          (ElemSegmentModuleField *)0x0) {
        (**(code **)(*(long *)local_170._M_t.
                              super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                              .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>.
                              _M_head_impl + 8))();
      }
      local_170._M_t.
      super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
      .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl =
           (tuple<wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
            )(_Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
              )0x0;
      EVar6 = Ok;
      goto LAB_00165420;
    }
  }
LAB_001653e4:
  (**(code **)(*(long *)tVar5.
                        super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                        .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl +
              8))(tVar5.
                  super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                  .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl);
  EVar6 = Error;
LAB_00165420:
  if (local_128 != local_118) {
    operator_delete(local_128);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  return (Result)EVar6;
}

Assistant:

Result WastParser::ParseElemModuleField(Module* module) {
  WABT_TRACE(ParseElemModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Elem);

  // With MVP text format the name here was intended to refer to the table
  // that the elem segment was part of, but we never did anything with this name
  // since there was only one table anyway.
  // With bulk-memory enabled this introduces a new name for the particular
  // elem segment.
  std::string initial_name;
  bool has_name = ParseBindVarOpt(&initial_name);

  std::string segment_name = initial_name;
  if (!options_->features.bulk_memory_enabled()) {
    segment_name = "";
  }
  auto field = MakeUnique<ElemSegmentModuleField>(loc, segment_name);
  if (options_->features.reference_types_enabled() &&
      Match(TokenType::Declare)) {
    field->elem_segment.kind = SegmentKind::Declared;
  }

  // Optional table specifier
  if (options_->features.bulk_memory_enabled()) {
    if (PeekMatchLpar(TokenType::Table)) {
      EXPECT(Lpar);
      EXPECT(Table);
      CHECK_RESULT(ParseVar(&field->elem_segment.table_var));
      EXPECT(Rpar);
    } else {
      ParseVarOpt(&field->elem_segment.table_var, Var(0, loc));
    }
  } else {
    if (has_name) {
      field->elem_segment.table_var = Var(initial_name, loc);
    } else {
      ParseVarOpt(&field->elem_segment.table_var, Var(0, loc));
    }
  }

  if ((field->elem_segment.kind != SegmentKind::Declared) &&
      !ParseOffsetExprOpt(&field->elem_segment.offset)) {
    field->elem_segment.kind = SegmentKind::Passive;
  }

  if (ParseRefTypeOpt(&field->elem_segment.elem_type)) {
    ParseElemExprListOpt(&field->elem_segment.elem_exprs);
  } else {
    field->elem_segment.elem_type = Type::Funcref;
    if (PeekMatch(TokenType::Func)) {
      EXPECT(Func);
    }
    ParseElemExprVarListOpt(&field->elem_segment.elem_exprs);
  }
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}